

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

vector<double,_std::allocator<double>_> *
ChebTools::Schur_realeigenvalues
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,MatrixXd *T)

{
  double *__args;
  double dVar1;
  iterator __position;
  long lVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar5 = (T->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar5) {
    lVar2 = 0;
    iVar4 = 0;
    do {
      if (lVar5 + -1 == lVar2) {
LAB_00135767:
        if ((iVar4 < 0) ||
           (lVar5 = (T->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                    m_rows, lVar5 <= lVar2)) {
LAB_001357cc:
          __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0x77,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 0>::operator()(Index, Index) const [Derived = Eigen::Matrix<double, -1, -1>, Level = 0]"
                       );
        }
        __args = (T->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                 m_data + lVar5 * lVar2 + lVar2;
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        iVar3 = iVar4;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                    ((vector<double,std::allocator<double>> *)__return_storage_ptr__,__position,
                     __args);
        }
        else {
          *__position._M_current = *__args;
          (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      else {
        iVar3 = iVar4 + 1;
        if ((iVar4 < -1) || (iVar4 == -1)) goto LAB_001357cc;
        lVar5 = (T->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_rows;
        if (lVar5 <= iVar3) goto LAB_001357cc;
        dVar1 = (T->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                m_data[lVar5 * lVar2 + (long)iVar3];
        if ((dVar1 == 0.0) && (!NAN(dVar1))) goto LAB_00135767;
      }
      iVar4 = iVar3 + 1;
      lVar2 = (long)iVar4;
      lVar5 = (T->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
      ;
    } while (lVar2 < lVar5);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<double> Schur_realeigenvalues(const Eigen::MatrixXd &T){
        std::vector<double> roots;
        for (int i = 0; i < T.cols(); ++i) {
            if (i == T.cols()-1 || T(i+1,i) == 0){
                // This is a real 1x1 block, if it were the second row in a 2x2 block it
                // would have been skipped in the next conditional
                roots.push_back(T(i, i));
            }
            else{
                // this is the upper left element of a 2x2 block,
                // keep moving, skip the next row too
                i += 1;
            }
        }
        return roots;
    }